

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::getShaderInterface
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,STAGES stage,
          string *out_interface)

{
  GLuint GVar1;
  GLchar *text;
  size_t sStack_60;
  GLuint type_size;
  size_t position;
  GLchar buffer [16];
  GLuint local_40;
  Type local_38;
  Type *local_28;
  Type *type;
  string *out_interface_local;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBOverrideQualifiersWithAPITest *this_local;
  
  type = (Type *)out_interface;
  out_interface_local._0_4_ = stage;
  out_interface_local._4_4_ = test_case_index;
  _stage_local = this;
  join_0x00000010_0x00000000_ = TestBase::getType((TestBase *)this,test_case_index);
  local_38.m_n_rows = local_40;
  local_38._0_8_ = buffer._8_8_;
  local_28 = &local_38;
  if ((STAGES)out_interface_local == GEOMETRY) {
    std::__cxx11::string::operator=((string *)type,getShaderInterface::gs);
  }
  else {
    if ((STAGES)out_interface_local != FRAGMENT) {
      std::__cxx11::string::operator=((string *)type,"");
      return;
    }
    std::__cxx11::string::operator=((string *)type,getShaderInterface::fs);
  }
  if ((STAGES)out_interface_local == GEOMETRY) {
    sStack_60 = 0;
    GVar1 = Utils::Type::GetSize(local_28);
    sprintf((char *)&position,"%d",(ulong)GVar1);
    Utils::replaceToken("SIZE",&stack0xffffffffffffffa0,(GLchar *)&position,(string *)type);
  }
  text = Utils::Type::GetGLSLTypeName(local_28);
  Utils::replaceAllTokens("TYPE",text,(string *)type);
  return;
}

Assistant:

void XFBOverrideQualifiersWithAPITest::getShaderInterface(GLuint test_case_index, Utils::Shader::STAGES stage,
														  std::string& out_interface)
{
	static const GLchar* gs = "const uint sizeof_type = SIZE;\n"
							  "\n"
							  "layout (xfb_offset = 2 * sizeof_type) flat out TYPE vegeta;\n"
							  "                                      flat out TYPE trunks;\n"
							  "layout (xfb_offset = 0)               flat out TYPE goku;\n"
							  "                                      flat out TYPE gohan;\n"
							  "\n"
							  /*
		 There is no packing qualifier for uniform block gs_block, according to spec, it should be "shared" by default,
		 the definition equals to "layout(binding=0, shared)", if the block is declared as shared, each block member will
		 not be packed, and each block member's layout in memory is implementation dependent, so we can't use the API
		 glBufferData() to update the UBO directly, we need to query each block member's offset first, then upload the
		 data to the corresponding offset, otherwise we can't get the correct data from UBO; to make the test passed,
		 we need to add the qualifier std140,  and change the declaration as layout(binding=0, std140), which can make
		 sure all the block members are packed and the application can upload the data by glBufferData() directly.
		 */
							  "layout(binding = 0, std140) uniform gs_block {\n"
							  "    TYPE uni_vegeta;\n"
							  "    TYPE uni_trunks;\n"
							  "    TYPE uni_goku;\n"
							  "    TYPE uni_gohan;\n"
							  "};\n";
	static const GLchar* fs = "flat in TYPE vegeta;\n"
							  "flat in TYPE trunks;\n"
							  "flat in TYPE goku;\n"
							  "flat in TYPE gohan;\n"
							  "\n"
							  "out vec4 fs_out;\n";

	const Utils::Type& type = getType(test_case_index);

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		out_interface = fs;
		break;
	case Utils::Shader::GEOMETRY:
		out_interface = gs;
		break;
	default:
		out_interface = "";
		return;
	}

	if (Utils::Shader::GEOMETRY == stage)
	{
		GLchar		 buffer[16];
		size_t		 position  = 0;
		const GLuint type_size = type.GetSize();

		sprintf(buffer, "%d", type_size);

		Utils::replaceToken("SIZE", position, buffer, out_interface);
	}

	Utils::replaceAllTokens("TYPE", type.GetGLSLTypeName(), out_interface);
}